

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *data;
  pointer pdVar2;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> r;
  Options local_a58;
  PolyFit<double> f;
  
  logger.minLevel = ERROR;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  IO::readData<double>((IO *)argv[1],(char *)&x,in_RDX);
  IO::readData<double>((IO *)argv[2],(char *)&y,data);
  local_a58.solver = EIGEN_JACOBI_SVD;
  local_a58.polyDeg = 3;
  local_a58.maxTrial = 500;
  local_a58.maxMPts = 10;
  local_a58.tolerance = 0.001;
  PolyFit<double>::PolyFit(&f,&x,&y,&local_a58);
  PolyFit<double>::solveRLS(&f);
  PolyFit<double>::evalPoly(&r,&f,&x);
  for (pdVar2 = r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    poVar1 = std::ostream::_M_insert<double>(*pdVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&r.super__Vector_base<double,_std::allocator<double>_>);
  PolyFit<double>::~PolyFit(&f);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
  return 0;
}

Assistant:

int main(int argc, char **argv) 
{
  // Sets the log level to DEBUG
  logger.setLevel(ERROR);

  try 
  {
    // Create (sample, signal) vectors
    std::vector<double> x,y;

    // Read in (sample, signal) = (x,y) values
    IO::readData<double>(argv[1],x);
    IO::readData<double>(argv[2],y);

    // Create options for fitting
    PolyFit<double>::Options options;

    options.polyDeg = 3; // 3-rd degree polynomial
    options.solver = PolyFit<double>::EIGEN_JACOBI_SVD; // SVD solver
    options.maxMPts = 10; // #Pts to use for fitting
    options.maxTrial = 500; // Max. nr. of trials
    options.tolerance = 0.001; // Distance tolerance for inlier

    // Create fitting object
    PolyFit<double>f(x,y,options);

    // Solve using RANSAC 
    f.solveRLS();

    // Output result
    //cout << f << endl;
    
    std::vector<double> r = f.evalPoly(x);
    std::vector<double>::iterator it = r.begin();
    while (it != r.end())
    {
      std::cout << *it << std::endl;
      ++it;
    }
  



  }
  catch (exception &e)
  {
    logger.log(ERROR, "[%s]: Exiting ...\n",
        __func__);
    exit(EXIT_FAILURE);
  }
  return 0;

}